

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O3

spv_result_t
spvtools::val::StructuredControlFlowChecks
          (ValidationState_t *_,Function *function,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *back_edges,
          vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          *postorder)

{
  uint uVar1;
  pointer ppVar2;
  pointer ppBVar3;
  uint uVar4;
  Construct *this;
  _List_node_base *p_Var5;
  bool bVar6;
  ConstructType CVar7;
  uint uVar8;
  spv_result_t sVar9;
  __hashtable *__h;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar10;
  mapped_type *pmVar11;
  _List_node_base *p_Var12;
  BasicBlock *pBVar13;
  BasicBlock *pBVar14;
  const_iterator cVar15;
  undefined8 uVar16;
  Instruction *pIVar17;
  long *plVar18;
  undefined8 *puVar19;
  _List_node_base *p_Var20;
  BasicBlock *pBVar21;
  Instruction **ppIVar22;
  BasicBlock **ppBVar23;
  ConstructType type;
  ConstructType type_00;
  char *pcVar24;
  pointer ppBVar25;
  uint32_t merge_block_id;
  char *pcVar26;
  long lVar27;
  undefined1 auVar28 [8];
  pointer ppVar29;
  pair<spvtools::val::BasicBlock_*,_bool> pVar30;
  uint32_t loop_header_id;
  uint32_t back_edge_block;
  uint32_t header_block;
  BasicBlock *pred;
  BasicBlock *succ;
  ConstructBlockSet construct_blocks;
  BasicBlock *merge_block;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range6;
  map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  loop_latch_blocks;
  spv_result_t local_414;
  undefined1 local_400 [32];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  Function *local_360;
  undefined1 local_358 [32];
  undefined1 local_338 [8];
  pointer local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [2];
  BasicBlock *local_308;
  BasicBlock *local_300;
  long local_2f8;
  pointer local_2f0;
  BasicBlock *pBStack_2e8;
  BasicBlock *local_2e0;
  BasicBlock *local_2d8;
  pointer local_2d0;
  _List_node_base *local_2c8;
  _List_node_base *local_2c0;
  string local_2b8;
  Instruction **local_298;
  Instruction *local_290;
  Instruction *local_288;
  pointer ppBStack_280;
  BasicBlock **local_278;
  pointer local_270;
  BasicBlock *local_268;
  pointer ppBStack_260;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [24];
  spv_result_t local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar29 = (back_edges->
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (back_edges->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_360 = function;
  local_2e0 = (BasicBlock *)postorder;
  local_2d8 = (BasicBlock *)back_edges;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppVar29 != ppVar2) {
    do {
      local_3e0._0_4_ = (*ppVar29).first;
      merge_block_id = (*ppVar29).second;
      local_3c0._0_4_ = merge_block_id;
      bVar6 = Function::IsBlockType(local_360,merge_block_id,kBlockTypeLoop);
      if (!bVar6) {
        pIVar17 = ValidationState_t::FindDef(_,local_3e0._0_4_);
        ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"Back-edges (",0xc);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_338,_,local_3e0._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_258,(char *)local_338,(long)local_330);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258," -> ",4);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_400,_,local_3c0._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_258,(char *)local_400._0_8_,local_400._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_258,") can only be formed between a block and a loop header.",
                   0x37);
        local_414 = local_88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_400 + 0x10)) {
          operator_delete((void *)local_400._0_8_,CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
        }
        goto LAB_001aa9ab;
      }
      local_258._0_8_ =
           std::
           map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[]((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                         *)&local_60,(key_type_conflict *)local_3c0);
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_258._0_8_,local_3e0,local_258);
      ppVar29 = ppVar29 + 1;
    } while (ppVar29 != ppVar2);
  }
  pvVar10 = Function::ordered_blocks(local_360);
  ppBVar25 = (pvVar10->
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppBVar3 = (pvVar10->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar25 != ppBVar3) {
LAB_001a9dda:
    pBVar13 = *ppBVar25;
    if ((pBVar13->structurally_reachable_ != true) ||
       (((pBVar13->type_).super__Base_bitset<1UL>._M_w & 4) == 0)) goto LAB_001a9e09;
    local_400._0_4_ = pBVar13->id_;
    pmVar11 = std::
              map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[]((map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                            *)&local_60,(key_type_conflict *)local_400);
    if ((pmVar11->_M_h)._M_element_count == 1) goto LAB_001a9e09;
    pIVar17 = ValidationState_t::FindDef(_,local_400._0_4_);
    ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"Loop header ",0xc);
    ValidationState_t::getIdName_abi_cxx11_((string *)local_338,_,local_400._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_258,(char *)local_338,(long)local_330);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258," is targeted by ",0x10)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_258," back-edge blocks but the standard requires exactly one",0x37);
    local_414 = local_88;
LAB_001aa9ab:
    if (local_338 != (undefined1  [8])local_328) {
      lVar27 = CONCAT71(local_328[0]._M_allocated_capacity._1_7_,local_328[0]._M_local_buf[0]);
      auVar28 = local_338;
      goto LAB_001aacb9;
    }
    goto LAB_001aacc1;
  }
LAB_001a9e12:
  p_Var12 = (_List_node_base *)Function::constructs_abi_cxx11_(local_360);
  p_Var20 = p_Var12->_M_next;
  p_Var5 = p_Var12;
  if (p_Var20 != p_Var12) {
    do {
      local_2c8 = p_Var5;
      ppBVar25 = (pointer)(local_3c0 + 0x10);
      this = (Construct *)(p_Var20 + 1);
      local_2c0 = p_Var20;
      pBVar13 = Construct::entry_block(this);
      if (pBVar13->structurally_reachable_ == true) {
        pBVar14 = Construct::exit_block(this);
        if (pBVar14 != (BasicBlock *)0x0) {
          bVar6 = BasicBlock::structurally_dominates(pBVar13,pBVar14);
          if (bVar6) {
            if ((pBVar13 == pBVar14) && ((this->type_ & 0xfffffffd) == 1)) {
              pIVar17 = ValidationState_t::FindDef(_,pBVar14->id_);
              ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar17)
              ;
              ValidationState_t::getIdName_abi_cxx11_((string *)local_400,_,pBVar13->id_);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_3e0,_,pBVar14->id_);
              pcVar26 = "does not strictly structurally dominate";
              pcVar24 = "";
              goto LAB_001aac06;
            }
            local_308 = pBVar14;
            CVar7 = Construct::type(this);
            if ((CVar7 != kContinue) ||
               (bVar6 = BasicBlock::structurally_postdominates(local_308,pBVar13),
               pBVar14 = local_308, bVar6)) {
              Construct::blocks((ConstructBlockSet *)local_338,this,local_360);
              local_400._8_8_ = (BasicBlock *)0x0;
              local_400[0x10] = '\0';
              local_3e0._8_8_ = (pointer)0x0;
              local_3d0[0] = '\0';
              local_3c0._8_8_ = (BasicBlock *)0x0;
              local_3c0._16_8_ = local_3c0._16_8_ & 0xffffffffffffff00;
              local_400._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_400 + 0x10);
              local_3e0._0_8_ = (BasicBlock *)(local_3e0 + 0x10);
              local_3c0._0_8_ = ppBVar25;
              CVar7 = Construct::type(this);
              ConstructNames_abi_cxx11_
                        ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_258,(val *)(ulong)CVar7,type);
              local_3a0._0_8_ = local_3c0;
              local_3a0._8_8_ = local_3e0;
              local_3a0._16_8_ = local_400;
              std::
              _Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::
              _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                          *)local_3a0,
                         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_p != local_208) {
                operator_delete(local_218._M_p,local_208[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_p != &local_228) {
                operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
              }
              uVar16 = local_328[0]._8_8_;
              if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)local_258._0_8_ !=
                  (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)(local_258 + 0x10)) {
                operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
                uVar16 = local_328[0]._8_8_;
              }
              for (; (_Rb_tree_node_base *)uVar16 != (_Rb_tree_node_base *)&local_330;
                  uVar16 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar16)) {
                pBVar14 = *(BasicBlock **)(uVar16 + 0x20);
                ppBVar3 = (pBVar14->successors_).
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (ppBVar25 = (pBVar14->successors_).
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_start; ppBVar25 != ppBVar3;
                    ppBVar25 = ppBVar25 + 1) {
                  local_380._0_8_ = *ppBVar25;
                  cVar15 = std::
                           _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                           ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                   *)local_338,(key_type *)local_380);
                  if ((cVar15._M_node == (_Rb_tree_node_base *)&local_330) &&
                     (bVar6 = Construct::IsStructuredExit(this,_,(BasicBlock *)local_380._0_8_),
                     !bVar6)) {
                    pIVar17 = ValidationState_t::FindDef(_,pBVar14->id_);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar17);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,"block <ID> ",0xb);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_3a0,_,pBVar14->id_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_3a0._0_8_,local_3a0._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258," exits the ",0xb);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_400._0_8_,local_400._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258," headed by <ID> ",0x10);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_358,_,pBVar13->id_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_358._0_8_,local_358._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,", but not via a structured exit",0x1f);
                    local_414 = local_88;
                    if ((Instruction *)local_358._0_8_ != (Instruction *)(local_358 + 0x10)) {
                      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
                    }
                    if ((BasicBlock *)local_3a0._0_8_ != (BasicBlock *)(local_3a0 + 0x10))
                    goto LAB_001aa38c;
                    goto LAB_001aa39c;
                  }
                }
                if (pBVar14 != pBVar13) {
                  ppBVar3 = (pBVar14->predecessors_).
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  for (ppBVar25 = (pBVar14->predecessors_).
                                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start; ppBVar25 != ppBVar3;
                      ppBVar25 = ppBVar25 + 1) {
                    local_3a0._0_8_ = *ppBVar25;
                    if ((((BasicBlock *)local_3a0._0_8_)->structurally_reachable_ == true) &&
                       (cVar15 = std::
                                 _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                 ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                         *)local_338,(key_type *)local_3a0),
                       cVar15._M_node == (_Rb_tree_node_base *)&local_330)) {
                      pIVar17 = ValidationState_t::FindDef(_,*(uint32_t *)local_3a0._0_8_);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar17);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"block <ID> ",0xb);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_258);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," branches to the ",0x11);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_400._0_8_,local_400._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," construct, but not to the ",0x1b);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_3e0._0_8_,local_3e0._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," <ID> ",6);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_258);
                      local_414 = local_88;
                      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_258);
                      bVar6 = false;
                      goto LAB_001aa495;
                    }
                  }
                  if ((((pBVar14->type_).super__Base_bitset<1UL>._M_w & 6) != 0) &&
                     ((pBVar14->terminator_[-1].inst_.opcode & 0xfffe) == 0xf6)) {
                    uVar8 = Instruction::GetOperandAs<unsigned_int>(pBVar14->terminator_ + -1,0);
                    pVar30 = Function::GetBlock(local_360,uVar8);
                    local_300 = pVar30.first;
                    if ((local_300->structurally_reachable_ == true) &&
                       (cVar15 = std::
                                 _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                 ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                         *)local_338,&local_300),
                       cVar15._M_node == (_Rb_tree_node_base *)&local_330)) {
                      pIVar17 = ValidationState_t::FindDef(_,pBVar14->id_);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar17);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,"Header block ",0xd);
                      ValidationState_t::getIdName_abi_cxx11_((string *)local_3a0,_,pBVar14->id_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_3a0._0_8_,local_3a0._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," is contained in the ",0x15);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_400._0_8_,local_400._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," construct headed by ",0x15);
                      ValidationState_t::getIdName_abi_cxx11_((string *)local_358,_,pBVar13->id_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_358._0_8_,local_358._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,", but its merge block ",0x16);
                      ValidationState_t::getIdName_abi_cxx11_((string *)local_380,_,uVar8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258,(char *)local_380._0_8_,local_380._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_258," is not",7);
                      local_414 = local_88;
                      if ((BasicBlock *)local_380._0_8_ != (BasicBlock *)(local_380 + 0x10)) {
                        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
                      }
                      if ((Instruction *)local_358._0_8_ == (Instruction *)(local_358 + 0x10))
                      goto LAB_001aa666;
                      goto LAB_001aa656;
                    }
                  }
                }
              }
              CVar7 = Construct::type(this);
              pBVar14 = local_2d8;
              if (CVar7 == kLoop) {
                uVar8 = Instruction::GetOperandAs<unsigned_int>(pBVar13->terminator_ + -1,1);
                pIVar17 = ValidationState_t::FindDef(_,uVar8);
                if (pBVar13->id_ != uVar8) {
                  ppBVar25 = ((pIVar17[1].block_)->predecessors_).
                             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_2d0 = ((pIVar17[1].block_)->predecessors_).
                              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  if (ppBVar25 != local_2d0) {
LAB_001aa188:
                    local_300 = *ppBVar25;
                    bVar6 = false;
                    for (pBVar21 = *(BasicBlock **)pBVar14; pBVar21 != pBVar14->immediate_dominator_
                        ; pBVar21 = (BasicBlock *)&pBVar21->immediate_dominator_) {
                      uVar1 = pBVar21->id_;
                      uVar4 = *(uint *)&pBVar21->field_0x4;
                      if (uVar8 == uVar4) {
                        bVar6 = (bool)(bVar6 | local_300->id_ == uVar1);
                      }
                    }
                    cVar15 = std::
                             _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                             ::find((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                                     *)local_338,&local_300);
                    if ((cVar15._M_node != (_Rb_tree_node_base *)&local_330) || (bVar6))
                    goto LAB_001aa1e4;
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,
                               local_300->terminator_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,"Block ",6);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_3a0,_,local_300->id_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_3a0._0_8_,local_3a0._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258," branches to the loop continue target ",0x26);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_358,_,uVar8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_358._0_8_,local_358._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,
                               ", but is not contained in the associated loop construct ",0x38);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_380,_,pBVar13->id_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_258,(char *)local_380._0_8_,local_380._8_8_);
                    local_414 = local_88;
                    if ((BasicBlock *)local_380._0_8_ != (BasicBlock *)(local_380 + 0x10)) {
                      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
                    }
                    if ((Instruction *)local_358._0_8_ != (Instruction *)(local_358 + 0x10)) {
LAB_001aa656:
                      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
                    }
LAB_001aa666:
                    if ((BasicBlock *)local_3a0._0_8_ != (BasicBlock *)(local_3a0 + 0x10)) {
LAB_001aa38c:
                      operator_delete((void *)local_3a0._0_8_,(ulong)(local_3a0._16_8_ + 1));
                    }
LAB_001aa39c:
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_258);
                    bVar6 = false;
                    goto LAB_001aa495;
                  }
                }
              }
LAB_001aa1f2:
              CVar7 = Construct::type(this);
              bVar6 = true;
              if ((CVar7 == kSelection) &&
                 (bVar6 = true, (pBVar13->terminator_->inst_).opcode == 0xfb)) {
                sVar9 = StructuredSwitchChecks(_,local_360,pBVar13->terminator_,pBVar13,local_308);
                bVar6 = sVar9 == SPV_SUCCESS;
                if (!bVar6) {
                  local_414 = sVar9;
                }
              }
LAB_001aa495:
              if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
                operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
              }
              if ((BasicBlock *)local_3e0._0_8_ != (BasicBlock *)(local_3e0 + 0x10)) {
                operator_delete((void *)local_3e0._0_8_,CONCAT71(local_3d0._1_7_,local_3d0[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_400 + 0x10)) {
                operator_delete((void *)local_400._0_8_,
                                CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
              }
              std::
              _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
              ::_M_erase((_Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                          *)local_338,
                         (_Link_type)
                         CONCAT71(local_328[0]._M_allocated_capacity._1_7_,
                                  local_328[0]._M_local_buf[0]));
              p_Var12 = local_2c8;
              if (bVar6) goto LAB_001aa4ff;
              goto LAB_001aacce;
            }
            pIVar17 = ValidationState_t::FindDef(_,local_308->id_);
            ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar17);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_400,_,pBVar13->id_);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_3e0,_,pBVar14->id_);
            local_3c0._0_8_ = ppBVar25;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3c0,"is not structurally post dominated by","");
            ConstructErrorString
                      ((string *)local_338,this,(string *)local_400,(string *)local_3e0,
                       (string *)local_3c0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_258,(char *)local_338,(long)local_330);
            local_414 = local_88;
            if (local_338 != (undefined1  [8])local_328) {
              operator_delete((void *)local_338,
                              CONCAT71(local_328[0]._M_allocated_capacity._1_7_,
                                       local_328[0]._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
              operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
            }
            if ((BasicBlock *)local_3e0._0_8_ != (BasicBlock *)(local_3e0 + 0x10))
            goto LAB_001aac9d;
          }
          else {
            pIVar17 = ValidationState_t::FindDef(_,pBVar14->id_);
            ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INVALID_CFG,pIVar17);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_400,_,pBVar13->id_);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_3e0,_,pBVar14->id_);
            pcVar26 = "does not structurally dominate";
            pcVar24 = "";
LAB_001aac06:
            local_3c0._0_8_ = ppBVar25;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,pcVar26,pcVar24);
            ConstructErrorString
                      ((string *)local_338,this,(string *)local_400,(string *)local_3e0,
                       (string *)local_3c0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_258,(char *)local_338,(long)local_330);
            local_414 = local_88;
            if (local_338 != (undefined1  [8])local_328) {
              operator_delete((void *)local_338,
                              CONCAT71(local_328[0]._M_allocated_capacity._1_7_,
                                       local_328[0]._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
              operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
            }
            if ((BasicBlock *)local_3e0._0_8_ != (BasicBlock *)(local_3e0 + 0x10)) {
LAB_001aac9d:
              operator_delete((void *)local_3e0._0_8_,CONCAT71(local_3d0._1_7_,local_3d0[0]) + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_400 + 0x10)) {
            lVar27 = CONCAT71(local_400._17_7_,local_400[0x10]);
            auVar28 = (undefined1  [8])local_400._0_8_;
LAB_001aacb9:
            operator_delete((void *)auVar28,lVar27 + 1);
          }
LAB_001aacc1:
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_258);
          goto LAB_001aacce;
        }
        local_338 = (undefined1  [8])local_328;
        local_330 = (pointer)0x0;
        local_328[0]._M_local_buf[0] = '\0';
        local_400._8_8_ = (BasicBlock *)0x0;
        local_400[0x10] = '\0';
        local_3e0._8_8_ = (pointer)0x0;
        local_3d0[0] = '\0';
        local_400._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_400 + 0x10);
        local_3e0._0_8_ = (BasicBlock *)(local_3e0 + 0x10);
        CVar7 = Construct::type(this);
        ConstructNames_abi_cxx11_
                  ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_258,(val *)(ulong)CVar7,type_00);
        local_3c0._0_8_ = local_3e0;
        local_3c0._8_8_ = local_400;
        local_3c0._16_8_ = local_338;
        std::_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::
        _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                    *)local_3c0,
                   (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_p != local_208) {
          operator_delete(local_218._M_p,local_208[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_p != &local_228) {
          operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
        }
        if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)local_258._0_8_ !=
            (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
        }
        pIVar17 = ValidationState_t::FindDef(_,pBVar13->id_);
        ValidationState_t::diag((DiagnosticStream *)local_258,_,SPV_ERROR_INTERNAL,pIVar17);
        std::operator+(&local_80,"Construct ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338);
        plVar18 = (long *)std::__cxx11::string::append((char *)&local_80);
        ppIVar22 = (Instruction **)(plVar18 + 2);
        if ((Instruction **)*plVar18 == ppIVar22) {
          local_288 = *ppIVar22;
          ppBStack_280 = (pointer)plVar18[3];
          local_298 = &local_288;
        }
        else {
          local_288 = *ppIVar22;
          local_298 = (Instruction **)*plVar18;
        }
        local_290 = (Instruction *)plVar18[1];
        *plVar18 = (long)ppIVar22;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        plVar18 = (long *)std::__cxx11::string::_M_append((char *)&local_298,local_400._0_8_);
        ppBVar23 = (BasicBlock **)(plVar18 + 2);
        if ((BasicBlock **)*plVar18 == ppBVar23) {
          local_268 = *ppBVar23;
          ppBStack_260 = (pointer)plVar18[3];
          local_278 = &local_268;
        }
        else {
          local_268 = *ppBVar23;
          local_278 = (BasicBlock **)*plVar18;
        }
        local_270 = (pointer)plVar18[1];
        *plVar18 = (long)ppBVar23;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        plVar18 = (long *)std::__cxx11::string::append((char *)&local_278);
        pBVar14 = (BasicBlock *)(plVar18 + 2);
        if ((BasicBlock *)*plVar18 == pBVar14) {
          local_2f0 = *(pointer *)pBVar14;
          pBStack_2e8 = (BasicBlock *)plVar18[3];
          local_300 = (BasicBlock *)&local_2f0;
        }
        else {
          local_2f0 = *(pointer *)pBVar14;
          local_300 = (BasicBlock *)*plVar18;
        }
        local_2f8 = plVar18[1];
        *plVar18 = (long)pBVar14;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,pBVar13->id_);
        ppBVar25 = (pointer)0xf;
        if (local_300 != (BasicBlock *)&local_2f0) {
          ppBVar25 = local_2f0;
        }
        if (ppBVar25 < (pointer)(local_2b8._M_string_length + local_2f8)) {
          uVar16 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            uVar16 = local_2b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < (pointer)(local_2b8._M_string_length + local_2f8)) goto LAB_001aaf5f;
          plVar18 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_2b8,0,(char *)0x0,(ulong)local_300);
        }
        else {
LAB_001aaf5f:
          plVar18 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_300,(ulong)local_2b8._M_dataplus._M_p);
        }
        local_380._0_8_ = local_380 + 0x10;
        pBVar13 = (BasicBlock *)(plVar18 + 2);
        if ((BasicBlock *)*plVar18 == pBVar13) {
          local_380._16_8_ = *(undefined8 *)pBVar13;
          local_380._24_8_ = plVar18[3];
        }
        else {
          local_380._16_8_ = *(undefined8 *)pBVar13;
          local_380._0_8_ = (BasicBlock *)*plVar18;
        }
        local_380._8_8_ = plVar18[1];
        *plVar18 = (long)pBVar13;
        plVar18[1] = 0;
        *(undefined1 *)&pBVar13->id_ = 0;
        plVar18 = (long *)std::__cxx11::string::append(local_380);
        local_358._0_8_ = local_358 + 0x10;
        pIVar17 = (Instruction *)(plVar18 + 2);
        if ((Instruction *)*plVar18 == pIVar17) {
          local_358._16_8_ =
               (pIVar17->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_358._24_8_ = plVar18[3];
        }
        else {
          local_358._16_8_ =
               (pIVar17->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_358._0_8_ = (Instruction *)*plVar18;
        }
        local_358._8_8_ = plVar18[1];
        *plVar18 = (long)pIVar17;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_358,local_3e0._0_8_);
        local_3a0._0_8_ = local_3a0 + 0x10;
        pBVar13 = (BasicBlock *)(puVar19 + 2);
        if ((BasicBlock *)*puVar19 == pBVar13) {
          local_3a0._16_8_ = *(undefined8 *)pBVar13;
          local_3a0._24_8_ = puVar19[3];
        }
        else {
          local_3a0._16_8_ = *(undefined8 *)pBVar13;
          local_3a0._0_8_ = (BasicBlock *)*puVar19;
        }
        local_3a0._8_8_ = puVar19[1];
        *puVar19 = pBVar13;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        plVar18 = (long *)std::__cxx11::string::append(local_3a0);
        ppBVar25 = (pointer)(plVar18 + 2);
        if ((pointer)*plVar18 == ppBVar25) {
          local_3c0._16_8_ = *ppBVar25;
          local_3c0._24_8_ = plVar18[3];
          local_3c0._0_8_ = local_3c0 + 0x10;
        }
        else {
          local_3c0._16_8_ = *ppBVar25;
          local_3c0._0_8_ = (pointer)*plVar18;
        }
        local_3c0._8_8_ = plVar18[1];
        *plVar18 = (long)ppBVar25;
        plVar18[1] = 0;
        *(undefined1 *)(plVar18 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_258,(char *)local_3c0._0_8_,local_3c0._8_8_);
        local_414 = local_88;
        if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
          operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
        }
        if ((BasicBlock *)local_3a0._0_8_ != (BasicBlock *)(local_3a0 + 0x10)) {
          operator_delete((void *)local_3a0._0_8_,(ulong)(local_3a0._16_8_ + 1));
        }
        if ((Instruction *)local_358._0_8_ != (Instruction *)(local_358 + 0x10)) {
          operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
        }
        if ((BasicBlock *)local_380._0_8_ != (BasicBlock *)(local_380 + 0x10)) {
          operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if (local_300 != (BasicBlock *)&local_2f0) {
          operator_delete(local_300,(long)local_2f0 + 1);
        }
        if (local_278 != &local_268) {
          operator_delete(local_278,(ulong)((long)&local_268->id_ + 1));
        }
        if (local_298 != &local_288) {
          operator_delete(local_298,
                          (ulong)((long)&(local_288->words_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_258);
        if ((BasicBlock *)local_3e0._0_8_ != (BasicBlock *)(local_3e0 + 0x10)) {
          operator_delete((void *)local_3e0._0_8_,CONCAT71(local_3d0._1_7_,local_3d0[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_400 + 0x10)) {
          operator_delete((void *)local_400._0_8_,CONCAT71(local_400._17_7_,local_400[0x10]) + 1);
        }
        if (local_338 != (undefined1  [8])local_328) {
          operator_delete((void *)local_338,
                          CONCAT71(local_328[0]._M_allocated_capacity._1_7_,
                                   local_328[0]._M_local_buf[0]) + 1);
        }
        goto LAB_001aacce;
      }
LAB_001aa4ff:
      p_Var20 = (((_List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *
                  )&local_2c0->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      p_Var5 = local_2c8;
    } while (p_Var20 != p_Var12);
  }
  local_414 = ValidateStructuredSelections
                        (_,(vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                            *)local_2e0);
LAB_001aacce:
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return local_414;
LAB_001a9e09:
  ppBVar25 = ppBVar25 + 1;
  if (ppBVar25 == ppBVar3) goto LAB_001a9e12;
  goto LAB_001a9dda;
LAB_001aa1e4:
  ppBVar25 = ppBVar25 + 1;
  if (ppBVar25 == local_2d0) goto LAB_001aa1f2;
  goto LAB_001aa188;
}

Assistant:

spv_result_t StructuredControlFlowChecks(
    ValidationState_t& _, Function* function,
    const std::vector<std::pair<uint32_t, uint32_t>>& back_edges,
    const std::vector<const BasicBlock*>& postorder) {
  /// Check all backedges target only loop headers and have exactly one
  /// back-edge branching to it

  // Map a loop header to blocks with back-edges to the loop header.
  std::map<uint32_t, std::unordered_set<uint32_t>> loop_latch_blocks;
  for (auto back_edge : back_edges) {
    uint32_t back_edge_block;
    uint32_t header_block;
    std::tie(back_edge_block, header_block) = back_edge;
    if (!function->IsBlockType(header_block, kBlockTypeLoop)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(back_edge_block))
             << "Back-edges (" << _.getIdName(back_edge_block) << " -> "
             << _.getIdName(header_block)
             << ") can only be formed between a block and a loop header.";
    }
    loop_latch_blocks[header_block].insert(back_edge_block);
  }

  // Check the loop headers have exactly one back-edge branching to it
  for (BasicBlock* loop_header : function->ordered_blocks()) {
    if (!loop_header->structurally_reachable()) continue;
    if (!loop_header->is_type(kBlockTypeLoop)) continue;
    auto loop_header_id = loop_header->id();
    auto num_latch_blocks = loop_latch_blocks[loop_header_id].size();
    if (num_latch_blocks != 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(loop_header_id))
             << "Loop header " << _.getIdName(loop_header_id)
             << " is targeted by " << num_latch_blocks
             << " back-edge blocks but the standard requires exactly one";
    }
  }

  // Check construct rules
  for (const Construct& construct : function->constructs()) {
    auto header = construct.entry_block();
    if (!header->structurally_reachable()) continue;
    auto merge = construct.exit_block();

    if (!merge) {
      std::string construct_name, header_name, exit_name;
      std::tie(construct_name, header_name, exit_name) =
          ConstructNames(construct.type());
      return _.diag(SPV_ERROR_INTERNAL, _.FindDef(header->id()))
             << "Construct " + construct_name + " with " + header_name + " " +
                    _.getIdName(header->id()) + " does not have a " +
                    exit_name + ". This may be a bug in the validator.";
    }

    // If the header is reachable, the merge is guaranteed to be structurally
    // reachable.
    if (!header->structurally_dominates(*merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not structurally dominate");
    }

    // If it's really a merge block for a selection or loop, then it must be
    // *strictly* structrually dominated by the header.
    if (construct.ExitBlockIsMergeBlock() && (header == merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not strictly structurally dominate");
    }

    // Check post-dominance for continue constructs.  But dominance and
    // post-dominance only make sense when the construct is reachable.
    if (construct.type() == ConstructType::kContinue) {
      if (!merge->structurally_postdominates(*header)) {
        return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
               << ConstructErrorString(construct, _.getIdName(header->id()),
                                       _.getIdName(merge->id()),
                                       "is not structurally post dominated by");
      }
    }

    Construct::ConstructBlockSet construct_blocks = construct.blocks(function);
    std::string construct_name, header_name, exit_name;
    std::tie(construct_name, header_name, exit_name) =
        ConstructNames(construct.type());
    for (auto block : construct_blocks) {
      // Check that all exits from the construct are via structured exits.
      for (auto succ : *block->successors()) {
        if (!construct_blocks.count(succ) &&
            !construct.IsStructuredExit(_, succ)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                 << "block <ID> " << _.getIdName(block->id()) << " exits the "
                 << construct_name << " headed by <ID> "
                 << _.getIdName(header->id())
                 << ", but not via a structured exit";
        }
      }
      if (block == header) continue;
      // Check that for all non-header blocks, all predecessors are within this
      // construct.
      for (auto pred : *block->predecessors()) {
        if (pred->structurally_reachable() && !construct_blocks.count(pred)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pred->id()))
                 << "block <ID> " << pred->id() << " branches to the "
                 << construct_name << " construct, but not to the "
                 << header_name << " <ID> " << header->id();
        }
      }

      if (block->is_type(BlockType::kBlockTypeSelection) ||
          block->is_type(BlockType::kBlockTypeLoop)) {
        size_t index = (block->terminator() - &_.ordered_instructions()[0]) - 1;
        const auto& merge_inst = _.ordered_instructions()[index];
        if (merge_inst.opcode() == spv::Op::OpSelectionMerge ||
            merge_inst.opcode() == spv::Op::OpLoopMerge) {
          uint32_t merge_id = merge_inst.GetOperandAs<uint32_t>(0);
          auto merge_block = function->GetBlock(merge_id).first;
          if (merge_block->structurally_reachable() &&
              !construct_blocks.count(merge_block)) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                   << "Header block " << _.getIdName(block->id())
                   << " is contained in the " << construct_name
                   << " construct headed by " << _.getIdName(header->id())
                   << ", but its merge block " << _.getIdName(merge_id)
                   << " is not";
          }
        }
      }
    }

    if (construct.type() == ConstructType::kLoop) {
      // If the continue target differs from the loop header, then check that
      // all edges into the continue construct come from within the loop.
      const auto index = header->terminator() - &_.ordered_instructions()[0];
      const auto& merge_inst = _.ordered_instructions()[index - 1];
      const auto continue_id = merge_inst.GetOperandAs<uint32_t>(1);
      const auto* continue_inst = _.FindDef(continue_id);
      // OpLabel instructions aren't stored as part of the basic block for
      // legacy reaasons. Grab the next instruction and use it's block pointer
      // instead.
      const auto next_index =
          (continue_inst - &_.ordered_instructions()[0]) + 1;
      const auto& next_inst = _.ordered_instructions()[next_index];
      const auto* continue_target = next_inst.block();
      if (header->id() != continue_id) {
        for (auto pred : *continue_target->predecessors()) {
          // Ignore back-edges from within the continue construct.
          bool is_back_edge = false;
          for (auto back_edge : back_edges) {
            uint32_t back_edge_block;
            uint32_t header_block;
            std::tie(back_edge_block, header_block) = back_edge;
            if (header_block == continue_id && back_edge_block == pred->id())
              is_back_edge = true;
          }
          if (!construct_blocks.count(pred) && !is_back_edge) {
            return _.diag(SPV_ERROR_INVALID_CFG, pred->terminator())
                   << "Block " << _.getIdName(pred->id())
                   << " branches to the loop continue target "
                   << _.getIdName(continue_id)
                   << ", but is not contained in the associated loop construct "
                   << _.getIdName(header->id());
          }
        }
      }
    }

    // Checks rules for case constructs.
    if (construct.type() == ConstructType::kSelection &&
        header->terminator()->opcode() == spv::Op::OpSwitch) {
      const auto terminator = header->terminator();
      if (auto error =
              StructuredSwitchChecks(_, function, terminator, header, merge)) {
        return error;
      }
    }
  }

  if (auto error = ValidateStructuredSelections(_, postorder)) {
    return error;
  }

  return SPV_SUCCESS;
}